

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

void archive_entry_copy_hardlink_w(archive_entry *entry,wchar_t *target)

{
  if (target == (wchar_t *)0x0) {
    if ((entry->ae_set & L'\x02') == L'\0') {
      archive_mstring_copy_wcs(&entry->ae_linkname,(wchar_t *)0x0);
      *(byte *)&entry->ae_set = (byte)entry->ae_set & 0xfe;
    }
  }
  else {
    archive_mstring_copy_wcs(&entry->ae_linkname,target);
    *(byte *)&entry->ae_set = (byte)entry->ae_set | 1;
  }
  return;
}

Assistant:

void
archive_entry_copy_hardlink_w(struct archive_entry *entry, const wchar_t *target)
{
	if (target == NULL && (entry->ae_set & AE_SET_SYMLINK))
		return;
	archive_mstring_copy_wcs(&entry->ae_linkname, target);
	if (target != NULL)
		entry->ae_set |= AE_SET_HARDLINK;
	else
		entry->ae_set &= ~AE_SET_HARDLINK;
}